

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall
HVectorBase<double>::saxpy<double,double>
          (HVectorBase<double> *this,double pivotX,HVectorBase<double> *pivot)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  iVar7 = this->count;
  piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pivot->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar8 = (ulong)(uint)pivot->count;
  if (pivot->count < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    iVar2 = piVar5[uVar9];
    dVar12 = pdVar4[iVar2];
    dVar1 = pdVar6[iVar2];
    if ((dVar12 == 0.0) && (!NAN(dVar12))) {
      lVar10 = (long)iVar7;
      iVar7 = iVar7 + 1;
      piVar3[lVar10] = iVar2;
    }
    dVar12 = dVar1 * pivotX + dVar12;
    uVar11 = -(ulong)(ABS(dVar12) < 1e-14);
    pdVar4[iVar2] = (double)(~uVar11 & (ulong)dVar12 | uVar11 & 0x358dee7a4ad4b81f);
  }
  this->count = iVar7;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}